

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way<true,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  unsigned_short *cache_output_00;
  size_t __n;
  lcp_t *lcp_output_00;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  bool bVar5;
  unsigned_short uVar6;
  MergeResult MVar7;
  MergeResult MVar8;
  uint uVar9;
  long lVar10;
  unsigned_short *puVar11;
  unsigned_short *cache_input0;
  ulong uVar12;
  size_t n_00;
  uchar **ppuVar13;
  lcp_t *plVar14;
  uchar **strings_output_00;
  lcp_t *lcp_input0;
  uchar **ppuVar15;
  byte bVar16;
  byte bVar17;
  size_t i_1;
  lcp_t lVar18;
  lcp_t in_R11;
  ulong uVar19;
  
  if (0x1f < n) {
    uVar12 = n >> 1;
    MVar7 = mergesort_cache_lcp_2way<true,unsigned_short>
                      (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                       uVar12);
    puVar11 = cache_input;
    plVar14 = lcp_input;
    ppuVar15 = strings_input;
    if (MVar7 != SortedInPlace) {
      puVar11 = cache_output;
      plVar14 = lcp_output;
      ppuVar15 = strings_output;
    }
    check_input<unsigned_short>(ppuVar15,plVar14,puVar11,uVar12);
    ppuVar15 = strings_input + uVar12;
    strings_output_00 = strings_output + uVar12;
    plVar14 = lcp_input + uVar12;
    lcp_output_00 = lcp_output + uVar12;
    puVar11 = cache_input + uVar12;
    cache_output_00 = cache_output + uVar12;
    n_00 = n - uVar12;
    MVar8 = mergesort_cache_lcp_2way<true,unsigned_short>
                      (ppuVar15,strings_output_00,plVar14,lcp_output_00,puVar11,cache_output_00,n_00
                      );
    cache_input0 = puVar11;
    lcp_input0 = plVar14;
    ppuVar13 = ppuVar15;
    if (MVar7 != SortedInPlace) {
      cache_input0 = cache_output_00;
      lcp_input0 = lcp_output_00;
      ppuVar13 = strings_output_00;
    }
    check_input<unsigned_short>(ppuVar13,lcp_input0,cache_input0,n_00);
    if (MVar7 != MVar8) {
      __n = uVar12 * 8;
      if (MVar7 == SortedInPlace) {
        memmove(strings_output,strings_input,__n);
        memcpy(cache_output,cache_input,n & 0xfffffffffffffffe);
        memcpy(lcp_output,lcp_input,__n);
        MVar7 = SortedInTemp;
      }
      else {
        memmove(strings_input,strings_output,__n);
        memcpy(cache_input,cache_output,n & 0xfffffffffffffffe);
        memcpy(lcp_input,lcp_output,__n);
        MVar8 = SortedInTemp;
      }
    }
    if (MVar7 == MVar8) {
      if (MVar7 == SortedInPlace) {
        merge_cache_lcp_2way<true,unsigned_short>
                  (strings_input,lcp_input,cache_input,uVar12,ppuVar15,plVar14,puVar11,n_00,
                   strings_output,lcp_output,cache_output);
      }
      else {
        merge_cache_lcp_2way<true,unsigned_short>
                  (strings_output,lcp_output,cache_output,uVar12,strings_output_00,lcp_output_00,
                   cache_output_00,n_00,strings_input,lcp_input,cache_input);
      }
      return (uint)(MVar7 == SortedInPlace);
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
  ppuVar15 = strings_input;
  if (1 < (long)n) {
    uVar12 = n & 0xffffffff;
    ppuVar13 = strings_input;
    do {
      iVar4 = (int)uVar12;
      uVar12 = (ulong)(iVar4 - 1);
      pbVar1 = ppuVar13[1];
      ppuVar13 = ppuVar13 + 1;
      for (ppuVar15 = ppuVar13; strings_input < ppuVar15; ppuVar15 = ppuVar15 + -1) {
        pbVar2 = ppuVar15[-1];
        bVar16 = *pbVar2;
        bVar17 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar16 != bVar17);
        if (bVar16 != 0 && bVar16 == bVar17) {
          in_R11 = 1;
          do {
            bVar16 = pbVar2[in_R11];
            bVar17 = pbVar1[in_R11];
            if (bVar16 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar16 == bVar17);
        }
        if (bVar16 <= bVar17) break;
        *ppuVar15 = pbVar2;
      }
      *ppuVar15 = pbVar1;
    } while (2 < iVar4);
  }
  puVar3 = *strings_input;
  lVar10 = 0;
  ppuVar13 = (uchar **)0x0;
  do {
    if ((puVar3[lVar10] == '\0') || (puVar3[lVar10] != strings_input[1][lVar10])) {
      bVar5 = false;
      ppuVar15 = ppuVar13;
    }
    else {
      ppuVar13 = (uchar **)((long)ppuVar13 + 1);
      bVar5 = true;
    }
    lVar10 = lVar10 + 1;
  } while (bVar5);
  *lcp_input = (lcp_t)ppuVar15;
  if (puVar3 != (uchar *)0x0) {
    if (*puVar3 == '\0') {
      uVar6 = 0;
    }
    else {
      uVar6 = CONCAT11(*puVar3,puVar3[1]);
    }
    *cache_input = uVar6;
    if (1 < n - 1) {
      uVar12 = 1;
      uVar19 = 1;
      do {
        puVar3 = strings_input[uVar19];
        iVar4 = (int)uVar12;
        uVar9 = iVar4 + 1;
        uVar12 = (ulong)uVar9;
        lVar10 = 0;
        lVar18 = 0;
        do {
          if ((puVar3[lVar10] == '\0') || (puVar3[lVar10] != strings_input[uVar12][lVar10])) {
            bVar5 = false;
            in_R11 = lVar18;
          }
          else {
            lVar18 = lVar18 + 1;
            bVar5 = true;
          }
          lVar10 = lVar10 + 1;
        } while (bVar5);
        lcp_input[uVar19] = in_R11;
        if (puVar3 == (uchar *)0x0) goto LAB_001ccd7c;
        if (puVar3[lcp_input[iVar4 - 1]] == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = CONCAT11(puVar3[lcp_input[iVar4 - 1]],puVar3[lcp_input[iVar4 - 1] + 1]);
        }
        cache_input[uVar19] = uVar6;
        uVar19 = (ulong)uVar9;
      } while (uVar19 < n - 1);
    }
    puVar3 = strings_input[n - 1];
    if (puVar3 != (uchar *)0x0) {
      if (puVar3[lcp_input[n - 2]] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar3[lcp_input[n - 2]],puVar3[lcp_input[n - 2] + 1]);
      }
      cache_input[n - 1] = uVar6;
      check_input<unsigned_short>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_001ccd7c:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}